

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestSubTypes_Test::TestBody(TypeTest_TestSubTypes_Test *this)

{
  allocator<wasm::Type> *this_00;
  initializer_list<wasm::Type> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Field> __l_01;
  bool bVar1;
  BasicHeapType BVar2;
  Entry *pEVar3;
  char *pcVar4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar5;
  reference pvVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  char *in_R9;
  Entry EVar9;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  Name name;
  AssertHelper local_b30;
  Message local_b28;
  uint local_b1c;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_17;
  Message local_b00;
  uint local_af4;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_16;
  Message local_ad8;
  uint local_acc;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar_15;
  Message local_ab0;
  uint local_aa4;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar_14;
  Message local_a88;
  uint local_a7c;
  HeapType local_a78;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_13;
  Message local_a58;
  uint local_a4c;
  HeapType local_a48;
  undefined1 local_a40 [8];
  AssertionResult gtest_ar_12;
  Message local_a28;
  uint local_a1c;
  HeapType local_a18;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_11;
  Message local_9f8;
  uint local_9ec;
  HeapType local_9e8;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_10;
  Message local_9c8;
  uint local_9bc;
  HeapType local_9b8;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_9;
  Message local_998;
  uint local_98c;
  HeapType local_988;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_8;
  Message local_968;
  uint local_95c;
  HeapType local_958;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_7;
  Message local_938;
  uint local_92c;
  HeapType local_928;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_6;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  depths;
  Message local_8d0;
  uint local_8c4;
  size_type local_8c0;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_8a0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> immSubTypes1;
  Message local_880;
  undefined1 local_878 [8];
  AssertionResult gtest_ar_4;
  Message local_860;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_3;
  Message local_840;
  uint local_834;
  size_type local_830;
  undefined1 local_828 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_810 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> subTypes0;
  Message local_7f0;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_1;
  Message local_7d0;
  uint local_7c4;
  size_type local_7c0;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_7a0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> immSubTypes0;
  SubTypes subTypes;
  Type local_710;
  Type local_708;
  Type local_700;
  Type local_6f8;
  iterator local_6f0;
  size_type local_6e8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_6e0;
  Type local_6c8;
  Type local_6c0;
  Signature local_6b8;
  HeapType local_6a8;
  Name local_6a0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_690;
  Builder local_688;
  Builder wasmBuilder;
  Module wasm;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_270;
  AssertHelper local_250;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  undefined1 local_200 [12];
  Entry local_1f0;
  Entry local_1e0;
  undefined1 local_1d0 [12];
  Entry local_1c0;
  Entry local_1b0;
  uintptr_t local_1a0;
  Field local_198;
  Array local_188;
  Entry local_178;
  uintptr_t local_168;
  Field local_160;
  Array local_150;
  Entry local_140;
  allocator<wasm::Field> local_129;
  uintptr_t local_128;
  Field local_120;
  iterator local_110;
  size_type local_108;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_100;
  Struct local_e8;
  Entry local_d0;
  allocator<wasm::Field> local_bd [13];
  uintptr_t local_b0;
  Field local_a8;
  iterator local_98;
  size_type local_90;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_88;
  Struct local_70;
  TypeBuilder local_58;
  TypeBuilder builder;
  Type local_48;
  Type sharedEqref;
  Type local_38;
  Type sharedAnyref;
  Type local_28;
  Type eqref;
  Type local_18;
  Type anyref;
  TypeTest_TestSubTypes_Test *this_local;
  
  anyref.id = (uintptr_t)this;
  ::wasm::HeapType::HeapType((HeapType *)&eqref,any);
  ::wasm::Type::Type(&local_18,(HeapType)eqref.id,Nullable,Inexact);
  ::wasm::HeapType::HeapType((HeapType *)&sharedAnyref,eq);
  ::wasm::Type::Type(&local_28,(HeapType)sharedAnyref.id,Nullable,Inexact);
  BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::any,Shared);
  ::wasm::HeapType::HeapType((HeapType *)&sharedEqref,BVar2);
  ::wasm::Type::Type(&local_38,(HeapType)sharedEqref.id,Nullable,Inexact);
  BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::eq,Shared);
  ::wasm::HeapType::HeapType((HeapType *)&builder,BVar2);
  ::wasm::Type::Type(&local_48,
                     (HeapType)
                     builder.impl._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,Nullable,
                     Inexact);
  ::wasm::TypeBuilder::TypeBuilder(&local_58,4);
  local_b0 = local_18.id;
  ::wasm::Field::Field(&local_a8,local_18,Immutable);
  local_98 = &local_a8;
  local_90 = 1;
  std::allocator<wasm::Field>::allocator(local_bd);
  __l_01._M_len = local_90;
  __l_01._M_array = local_98;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_88,__l_01,local_bd);
  ::wasm::Struct::Struct(&local_70,&local_88);
  local_d0 = ::wasm::TypeBuilder::operator[](&local_58,0);
  pEVar3 = ::wasm::TypeBuilder::Entry::setOpen(&local_d0,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar3,&local_70);
  ::wasm::Struct::~Struct(&local_70);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_88);
  std::allocator<wasm::Field>::~allocator(local_bd);
  local_128 = local_28.id;
  ::wasm::Field::Field(&local_120,local_28,Immutable);
  local_110 = &local_120;
  local_108 = 1;
  std::allocator<wasm::Field>::allocator(&local_129);
  __l_00._M_len = local_108;
  __l_00._M_array = local_110;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_100,__l_00,&local_129);
  ::wasm::Struct::Struct(&local_e8,&local_100);
  local_140 = ::wasm::TypeBuilder::operator[](&local_58,1);
  pEVar3 = ::wasm::TypeBuilder::Entry::setOpen(&local_140,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar3,&local_e8);
  ::wasm::Struct::~Struct(&local_e8);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_100);
  std::allocator<wasm::Field>::~allocator(&local_129);
  local_168 = local_38.id;
  ::wasm::Field::Field(&local_160,local_38,Immutable);
  ::wasm::Array::Array(&local_150,local_160);
  local_178 = ::wasm::TypeBuilder::operator[](&local_58,2);
  pEVar3 = ::wasm::TypeBuilder::Entry::setOpen(&local_178,true);
  pEVar3 = ::wasm::TypeBuilder::Entry::setShared(pEVar3,Shared);
  ::wasm::TypeBuilder::Entry::operator=(pEVar3,&local_150);
  local_1a0 = local_48.id;
  ::wasm::Field::Field(&local_198,local_48,Immutable);
  ::wasm::Array::Array(&local_188,local_198);
  local_1b0 = ::wasm::TypeBuilder::operator[](&local_58,3);
  pEVar3 = ::wasm::TypeBuilder::Entry::setOpen(&local_1b0,true);
  pEVar3 = ::wasm::TypeBuilder::Entry::setShared(pEVar3,Shared);
  ::wasm::TypeBuilder::Entry::operator=(pEVar3,&local_188);
  local_1c0 = ::wasm::TypeBuilder::operator[](&local_58,1);
  local_1e0 = ::wasm::TypeBuilder::operator[](&local_58,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_1d0,&local_1e0);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_1d0._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1d0[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1d0._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_1c0,other);
  local_1f0 = ::wasm::TypeBuilder::operator[](&local_58,3);
  EVar9 = ::wasm::TypeBuilder::operator[](&local_58,2);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar9.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_200,
             (Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_200._0_8_;
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_200[8];
  other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_200._9_3_;
  ::wasm::TypeBuilder::Entry::subTypeOf(&local_1f0,other_00);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_240,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)local_240,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5d1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  if (bVar1) {
    pvVar5 = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &wasm.tagsMap._M_h._M_single_bucket,pvVar5);
    ::wasm::Module::Module((Module *)&wasmBuilder);
    ::wasm::Builder::Builder(&local_688,(Module *)&wasmBuilder);
    ::wasm::Name::Name(&local_6a0,"func");
    ::wasm::Type::Type(&local_6c0,none);
    ::wasm::Type::Type(&local_6c8,none);
    ::wasm::Signature::Signature(&local_6b8,local_6c0,local_6c8);
    ::wasm::HeapType::HeapType(&local_6a8,local_6b8);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &wasm.tagsMap._M_h._M_single_bucket,0);
    ::wasm::Type::Type(&local_710,(HeapType)pvVar6->id,Nullable,Inexact);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &wasm.tagsMap._M_h._M_single_bucket,1);
    ::wasm::Type::Type(&local_708,(HeapType)pvVar6->id,Nullable,Inexact);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &wasm.tagsMap._M_h._M_single_bucket,2);
    ::wasm::Type::Type(&local_700,(HeapType)pvVar6->id,Nullable,Inexact);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &wasm.tagsMap._M_h._M_single_bucket,3);
    ::wasm::Type::Type(&local_6f8,(HeapType)pvVar6->id,Nullable,Inexact);
    local_6f0 = &local_710;
    local_6e8 = 4;
    this_00 = (allocator<wasm::Type> *)((long)&subTypes.typeSubTypes._M_h._M_single_bucket + 7);
    std::allocator<wasm::Type>::allocator(this_00);
    __l._M_len = local_6e8;
    __l._M_array = local_6f0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_6e0,__l,this_00);
    ::wasm::Builder::makeNop(&local_688);
    name.super_IString.str._M_str = (char *)local_6a0.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_690;
    ::wasm::Builder::makeFunction
              (name,(HeapType)local_6a0.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_6a8.id,
               (Expression *)&local_6e0);
    ::wasm::Module::addFunction((unique_ptr *)&wasmBuilder);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_690);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_6e0);
    std::allocator<wasm::Type>::~allocator
              ((allocator<wasm::Type> *)((long)&subTypes.typeSubTypes._M_h._M_single_bucket + 7));
    ::wasm::SubTypes::SubTypes
              ((SubTypes *)
               &immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(Module *)&wasmBuilder);
    pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &wasm.tagsMap._M_h._M_single_bucket,0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar6->id;
    pvVar5 = ::wasm::SubTypes::getImmediateSubTypes
                       ((SubTypes *)
                        &immSubTypes0.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,
                        (HeapType)
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_7a0,pvVar5);
    local_7c0 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                          ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_7a0);
    local_7c4 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_7b8,"immSubTypes0.size()","1u",&local_7c0,&local_7c4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
    if (!bVar1) {
      testing::Message::Message(&local_7d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x5e1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_7d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_7d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
    if (bVar1) {
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_7a0,0);
      pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &wasm.tagsMap._M_h._M_single_bucket,1);
      testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                ((EqHelper *)local_7e8,"immSubTypes0[0]","built[1]",pvVar6,pvVar7);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
      if (!bVar1) {
        testing::Message::Message(&local_7f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x5e2,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7f0);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_7f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
      pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &wasm.tagsMap._M_h._M_single_bucket,0);
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pvVar6->id;
      ::wasm::SubTypes::getSubTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_810,
                 (SubTypes *)
                 &immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (HeapType)
                 gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
      local_830 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_810);
      local_834 = 2;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((EqHelper *)local_828,"subTypes0.size()","2u",&local_830,&local_834);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_828);
      if (!bVar1) {
        testing::Message::Message(&local_840);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_828);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x5e4,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_840);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_840);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
      if (bVar1) {
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_810,0);
        pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,1);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_858,"subTypes0[0]","built[1]",pvVar6,pvVar7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
        if (!bVar1) {
          testing::Message::Message(&local_860);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5e5,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_860);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_860);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_810,1);
        pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,0);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_878,"subTypes0[1]","built[0]",pvVar6,pvVar7);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
        if (!bVar1) {
          testing::Message::Message(&local_880);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_878);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5e6,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_880);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_880);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,1);
        gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )pvVar6->id;
        pvVar5 = ::wasm::SubTypes::getImmediateSubTypes
                           ((SubTypes *)
                            &immSubTypes0.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (HeapType)
                            gtest_ar_5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_8a0,pvVar5);
        local_8c0 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_8a0)
        ;
        local_8c4 = 0;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  ((EqHelper *)local_8b8,"immSubTypes1.size()","0u",&local_8c0,&local_8c4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
        if (!bVar1) {
          testing::Message::Message(&local_8d0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&depths._M_h._M_single_bucket,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5e8,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&depths._M_h._M_single_bucket,&local_8d0);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)&depths._M_h._M_single_bucket);
          testing::Message::~Message(&local_8d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
        ::wasm::SubTypes::getMaxDepths
                  ((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                    *)&gtest_ar_6.message_,
                   (SubTypes *)
                   &immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::any,Unshared);
        ::wasm::HeapType::HeapType(&local_928,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_928);
        local_92c = 4;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_920,"depths[HeapTypes::any.getBasic(Unshared)]","4u",pmVar8,
                   &local_92c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
        if (!bVar1) {
          testing::Message::Message(&local_938);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5eb,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_938);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_938);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::any,Shared);
        ::wasm::HeapType::HeapType(&local_958,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_958);
        local_95c = 4;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_950,"depths[HeapTypes::any.getBasic(Shared)]","4u",pmVar8,
                   &local_95c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
        if (!bVar1) {
          testing::Message::Message(&local_968);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5ec,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,&local_968);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_968);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::eq,Unshared);
        ::wasm::HeapType::HeapType(&local_988,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_988);
        local_98c = 3;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_980,"depths[HeapTypes::eq.getBasic(Unshared)]","3u",pmVar8,
                   &local_98c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
        if (!bVar1) {
          testing::Message::Message(&local_998);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_980);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5ed,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_998);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_998);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::eq,Shared);
        ::wasm::HeapType::HeapType(&local_9b8,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_9b8);
        local_9bc = 3;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_9b0,"depths[HeapTypes::eq.getBasic(Shared)]","3u",pmVar8,
                   &local_9bc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
        if (!bVar1) {
          testing::Message::Message(&local_9c8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5ee,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_9c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_9c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::struct_,Unshared);
        ::wasm::HeapType::HeapType(&local_9e8,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_9e8);
        local_9ec = 2;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_9e0,"depths[HeapTypes::struct_.getBasic(Unshared)]","2u",pmVar8
                   ,&local_9ec);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
        if (!bVar1) {
          testing::Message::Message(&local_9f8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5ef,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_9f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_9f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::struct_,Shared);
        ::wasm::HeapType::HeapType(&local_a18,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_a18);
        local_a1c = 0;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_a10,"depths[HeapTypes::struct_.getBasic(Shared)]","0u",pmVar8,
                   &local_a1c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
        if (!bVar1) {
          testing::Message::Message(&local_a28);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f0,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,&local_a28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_a28);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::array,Unshared);
        ::wasm::HeapType::HeapType(&local_a48,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_a48);
        local_a4c = 0;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_a40,"depths[HeapTypes::array.getBasic(Unshared)]","0u",pmVar8,
                   &local_a4c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a40);
        if (!bVar1) {
          testing::Message::Message(&local_a58);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a40);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f1,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_13.message_,&local_a58);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
          testing::Message::~Message(&local_a58);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a40);
        BVar2 = ::wasm::HeapType::getBasic((HeapType *)&::wasm::HeapTypes::array,Shared);
        ::wasm::HeapType::HeapType(&local_a78,BVar2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,&local_a78);
        local_a7c = 2;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_a70,"depths[HeapTypes::array.getBasic(Shared)]","2u",pmVar8,
                   &local_a7c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
        if (!bVar1) {
          testing::Message::Message(&local_a88);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f2,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14.message_,&local_a88);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
          testing::Message::~Message(&local_a88);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,0);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,pvVar6);
        local_aa4 = 1;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_aa0,"depths[built[0]]","1u",pmVar8,&local_aa4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
        if (!bVar1) {
          testing::Message::Message(&local_ab0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_aa0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f3,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_15.message_,&local_ab0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
          testing::Message::~Message(&local_ab0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,1);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,pvVar6);
        local_acc = 0;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_ac8,"depths[built[1]]","0u",pmVar8,&local_acc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
        if (!bVar1) {
          testing::Message::Message(&local_ad8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ac8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f4,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_16.message_,&local_ad8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
          testing::Message::~Message(&local_ad8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,2);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,pvVar6);
        local_af4 = 1;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_af0,"depths[built[2]]","1u",pmVar8,&local_af4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
        if (!bVar1) {
          testing::Message::Message(&local_b00);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f5,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_17.message_,&local_b00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
          testing::Message::~Message(&local_b00);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &wasm.tagsMap._M_h._M_single_bucket,3);
        pmVar8 = std::
                 unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                               *)&gtest_ar_6.message_,pvVar6);
        local_b1c = 0;
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_b18,"depths[built[3]]","0u",pmVar8,&local_b1c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
        if (!bVar1) {
          testing::Message::Message(&local_b28);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x5f6,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b30,&local_b28);
          testing::internal::AssertHelper::~AssertHelper(&local_b30);
          testing::Message::~Message(&local_b28);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
        std::
        unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
        ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                          *)&gtest_ar_6.message_);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_8a0);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_810);
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_7a0);
    ::wasm::SubTypes::~SubTypes
              ((SubTypes *)
               &immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::Module::~Module((Module *)&wasmBuilder);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &wasm.tagsMap._M_h._M_single_bucket);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_58);
  return;
}

Assistant:

TEST_F(TypeTest, TestSubTypes) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type sharedAnyref = Type(HeapTypes::any.getBasic(Shared), Nullable);
  Type sharedEqref = Type(HeapTypes::eq.getBasic(Shared), Nullable);

  // Build type types, the second of which is a subtype.
  TypeBuilder builder(4);
  builder[0].setOpen() = Struct({Field(anyref, Immutable)});
  builder[1].setOpen() = Struct({Field(eqref, Immutable)});
  // Make shared versions, too.
  builder[2].setOpen().setShared() = Array(Field(sharedAnyref, Immutable));
  builder[3].setOpen().setShared() = Array(Field(sharedEqref, Immutable));
  builder[1].subTypeOf(builder[0]);
  builder[3].subTypeOf(builder[2]);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  // Build a tiny wasm module that uses the types, so that we can test the
  // SubTypes utility code.
  Module wasm;
  Builder wasmBuilder(wasm);
  wasm.addFunction(wasmBuilder.makeFunction("func",
                                            Signature(Type::none, Type::none),
                                            {Type(built[0], Nullable),
                                             Type(built[1], Nullable),
                                             Type(built[2], Nullable),
                                             Type(built[3], Nullable)},
                                            wasmBuilder.makeNop()));
  SubTypes subTypes(wasm);
  auto immSubTypes0 = subTypes.getImmediateSubTypes(built[0]);
  ASSERT_EQ(immSubTypes0.size(), 1u);
  EXPECT_EQ(immSubTypes0[0], built[1]);
  auto subTypes0 = subTypes.getSubTypes(built[0]);
  ASSERT_EQ(subTypes0.size(), 2u);
  EXPECT_EQ(subTypes0[0], built[1]);
  EXPECT_EQ(subTypes0[1], built[0]);
  auto immSubTypes1 = subTypes.getImmediateSubTypes(built[1]);
  EXPECT_EQ(immSubTypes1.size(), 0u);

  auto depths = subTypes.getMaxDepths();
  EXPECT_EQ(depths[HeapTypes::any.getBasic(Unshared)], 4u);
  EXPECT_EQ(depths[HeapTypes::any.getBasic(Shared)], 4u);
  EXPECT_EQ(depths[HeapTypes::eq.getBasic(Unshared)], 3u);
  EXPECT_EQ(depths[HeapTypes::eq.getBasic(Shared)], 3u);
  EXPECT_EQ(depths[HeapTypes::struct_.getBasic(Unshared)], 2u);
  EXPECT_EQ(depths[HeapTypes::struct_.getBasic(Shared)], 0u);
  EXPECT_EQ(depths[HeapTypes::array.getBasic(Unshared)], 0u);
  EXPECT_EQ(depths[HeapTypes::array.getBasic(Shared)], 2u);
  EXPECT_EQ(depths[built[0]], 1u);
  EXPECT_EQ(depths[built[1]], 0u);
  EXPECT_EQ(depths[built[2]], 1u);
  EXPECT_EQ(depths[built[3]], 0u);
}